

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

ErrorGenerator *
anon_unknown.dwarf_7f1d8::ErrorMessages::ErrorGeneratorBuilder
          (ErrorGenerator *__return_storage_ptr__,string *errorMessage)

{
  string local_38 [32];
  string *local_18;
  string *errorMessage_local;
  
  local_18 = errorMessage;
  errorMessage_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string(local_38,(string *)errorMessage);
  std::function<void(Json::Value_const*,cmJSONState*)>::
  function<(anonymous_namespace)::ErrorMessages::ErrorGeneratorBuilder(std::__cxx11::string)::__0,void>
            ((function<void(Json::Value_const*,cmJSONState*)> *)__return_storage_ptr__,
             (anon_class_32_1_68444add *)local_38);
  (anonymous_namespace)::ErrorMessages::ErrorGeneratorBuilder(std::__cxx11::string)::$_0::~__0
            ((__0 *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ErrorGenerator ErrorGeneratorBuilder(std::string errorMessage)
{
  return [errorMessage](const Json::Value* value, cmJSONState* state) -> void {
    state->AddErrorAtValue(errorMessage, value);
  };
}